

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

void raviV_op_sub(lua_State *L,TValue *ra,TValue *rb,TValue *rc)

{
  TValue *io;
  lua_Number lVar1;
  lua_Number lVar2;
  
  if (rb->tt_ == 3) {
    lVar1 = (rb->value_).n;
  }
  else {
    if (rb->tt_ != 0x13) goto LAB_001307c1;
    if (rc->tt_ == 0x13) {
      (ra->value_).gc = (GCObject *)((long)(rb->value_).gc - (rc->value_).i);
      ra->tt_ = 0x13;
      return;
    }
    lVar1 = (lua_Number)(rb->value_).i;
  }
  if (rc->tt_ == 0x13) {
    lVar2 = (lua_Number)(rc->value_).i;
  }
  else {
    if (rc->tt_ != 3) {
LAB_001307c1:
      luaT_trybinTM(L,rb,rc,ra,TM_SUB);
      return;
    }
    lVar2 = (rc->value_).n;
  }
  (ra->value_).n = lVar1 - lVar2;
  ra->tt_ = 3;
  return;
}

Assistant:

void raviV_op_sub(lua_State *L, TValue *ra, TValue *rb, TValue *rc) {
  lua_Number nb;
  lua_Number nc;
  if (ttisinteger(rb) && ttisinteger(rc)) {
    lua_Integer ib = ivalue(rb);
    lua_Integer ic = ivalue(rc);
    setivalue(ra, intop(-, ib, ic));
  }
  else if (tonumberns(rb, nb) && tonumberns(rc, nc)) {
    setfltvalue(ra, luai_numsub(L, nb, nc));
  }
  else {
    luaT_trybinTM(L, rb, rc, ra, TM_SUB);
  }
}